

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O0

optional<bssl::der::BitString> * __thiscall
bssl::der::ParseBitString(optional<bssl::der::BitString> *__return_storage_ptr__,der *this,Input in)

{
  Input bytes_00;
  Input in_00;
  bool bVar1;
  size_t len;
  BitString local_70;
  byte local_54;
  byte local_53;
  undefined1 auStack_50 [4];
  uint8_t mask;
  uint8_t last_byte;
  Input bytes;
  uint8_t unused_bits;
  undefined1 local_28 [8];
  ByteReader reader;
  Input in_local;
  
  in_00.data_.size_ = (size_t)in.data_.data_;
  in_00.data_.data_ = (uchar *)this;
  reader.data_.size_ = (size_t)this;
  ByteReader::ByteReader((ByteReader *)local_28,in_00);
  bVar1 = ByteReader::ReadByte((ByteReader *)local_28,(uint8_t *)((long)&bytes.data_.size_ + 7));
  if (bVar1) {
    if (bytes.data_.size_._7_1_ < 8) {
      Input::Input((Input *)auStack_50);
      len = ByteReader::BytesLeft((ByteReader *)local_28);
      bVar1 = ByteReader::ReadBytes((ByteReader *)local_28,len,(Input *)auStack_50);
      if (bVar1) {
        if (bytes.data_.size_._7_1_ != 0) {
          bVar1 = Input::empty((Input *)auStack_50);
          if (bVar1) {
            ::std::optional<bssl::der::BitString>::optional(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          local_53 = Input::back((Input *)auStack_50);
          local_54 = (byte)(0xff >> (8 - bytes.data_.size_._7_1_ & 0x1f));
          if ((local_54 & local_53) != 0) {
            ::std::optional<bssl::der::BitString>::optional(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
        }
        bytes_00.data_.size_ = (size_t)bytes.data_.data_;
        bytes_00.data_.data_ = _auStack_50;
        BitString::BitString(&local_70,bytes_00,bytes.data_.size_._7_1_);
        ::std::optional<bssl::der::BitString>::optional<bssl::der::BitString,_true>
                  (__return_storage_ptr__,&local_70);
      }
      else {
        ::std::optional<bssl::der::BitString>::optional(__return_storage_ptr__);
      }
    }
    else {
      ::std::optional<bssl::der::BitString>::optional(__return_storage_ptr__);
    }
  }
  else {
    ::std::optional<bssl::der::BitString>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<BitString> ParseBitString(Input in) {
  ByteReader reader(in);

  // From ITU-T X.690, section 8.6.2.2 (applies to BER, CER, DER):
  //
  // The initial octet shall encode, as an unsigned binary integer with
  // bit 1 as the least significant bit, the number of unused bits in the final
  // subsequent octet. The number shall be in the range zero to seven.
  uint8_t unused_bits;
  if (!reader.ReadByte(&unused_bits)) {
    return std::nullopt;
  }
  if (unused_bits > 7) {
    return std::nullopt;
  }

  Input bytes;
  if (!reader.ReadBytes(reader.BytesLeft(), &bytes)) {
    return std::nullopt;  // Not reachable.
  }

  // Ensure that unused bits in the last byte are set to 0.
  if (unused_bits > 0) {
    // From ITU-T X.690, section 8.6.2.3 (applies to BER, CER, DER):
    //
    // If the bitstring is empty, there shall be no subsequent octets,
    // and the initial octet shall be zero.
    if (bytes.empty()) {
      return std::nullopt;
    }
    uint8_t last_byte = bytes.back();

    // From ITU-T X.690, section 11.2.1 (applies to CER and DER, but not BER):
    //
    // Each unused bit in the final octet of the encoding of a bit string value
    // shall be set to zero.
    uint8_t mask = 0xFF >> (8 - unused_bits);
    if ((mask & last_byte) != 0) {
      return std::nullopt;
    }
  }

  return BitString(bytes, unused_bits);
}